

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O1

QFlags<Qt::AlignmentFlag>
QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>(QVariant *data)

{
  PrivateShared *pPVar1;
  bool bVar2;
  __atomic_base<int> _Var3;
  __atomic_base<int> _Var4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar5;
  QMetaType QVar6;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_i = ::QVariant::typeId(data);
  _Var4._M_i = (__int_type)QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType.typeId;
  if ((__atomic_base<int>)
      QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var4._M_i = QMetaType::registerHelper
                           (&QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType);
  }
  if (_Var3._M_i == _Var4._M_i) {
    local_20.d_ptr = &QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType;
    local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(data->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = comparesEqual(&local_28,&local_20);
    if (bVar2) {
      if (((data->d).field_0x18 & 1) != 0) {
        pPVar1 = (data->d).data.shared;
        data = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      local_28.d_ptr._0_4_ =
           (QFlagsStorage<Qt::AlignmentFlag>)
           (QFlagsStorage<Qt::AlignmentFlag>)
           *(undefined4 *)&((Private *)&((PrivateShared *)data)->field_0x0)->data;
    }
    else {
      local_28.d_ptr = (QMetaTypeInterface *)((ulong)local_28.d_ptr._4_4_ << 0x20);
      QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((data->d).field_0x18 & 1) != 0) {
        pPVar1 = (data->d).data.shared;
        data = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar6,data,local_20,&local_28);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)local_28.d_ptr._0_4_;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar5.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)::QVariant::toInt((bool *)data);
    return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)QVar5.super_QFlagsStorage<Qt::AlignmentFlag>.i
    ;
  }
  __stack_chk_fail();
}

Assistant:

T legacyFlagValueFromModelData(const QVariant &data)
{
    if (data.userType() == qMetaTypeId<T>()) {
        return data.value<T>();
    } else if (std::is_same_v<std::underlying_type_t<typename T::enum_type>, int> ||
               std::is_same_v<std::underlying_type_t<typename T::enum_type>, uint>) {
        return T::fromInt(data.toInt());
    }

    return T();
}